

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compress_usingDict
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,int compressionLevel)

{
  size_t sVar1;
  long in_RDI;
  void *in_R8;
  long in_R9;
  void *in_stack_00000008;
  int in_stack_00000010;
  ZSTD_parameters params;
  undefined4 in_stack_ffffffffffffff80;
  int iVar2;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  int iVar3;
  ZSTD_CCtx *in_stack_ffffffffffffffa8;
  ZSTD_CCtx_params *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  ZSTD_CCtx_params *in_stack_ffffffffffffffc8;
  
  if (in_R9 == 0) {
    in_stack_00000008 = (void *)0x0;
  }
  iVar3 = in_stack_00000010;
  ZSTD_getParams_internal
            ((int)((ulong)in_R8 >> 0x20),CONCAT44(in_stack_00000010,in_stack_ffffffffffffff98),
             (size_t)in_stack_00000008,(ZSTD_cParamMode_e)((ulong)in_stack_ffffffffffffff88 >> 0x20)
            );
  if (in_stack_ffffffffffffffc4 != 1) {
    __assert_fail("params.fParams.contentSizeFlag == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x6533,
                  "size_t ZSTD_compress_usingDict(ZSTD_CCtx *, void *, size_t, const void *, size_t, const void *, size_t, int)"
                 );
  }
  sVar1 = in_RDI + 0x1b0;
  iVar2 = in_stack_00000010;
  if (in_stack_00000010 == 0) {
    iVar2 = 3;
  }
  ZSTD_CCtxParams_init_internal
            (in_stack_ffffffffffffffb0,(ZSTD_parameters *)in_stack_ffffffffffffffa8,
             (int)((ulong)in_R8 >> 0x20));
  sVar1 = ZSTD_compress_advanced_internal
                    (in_stack_ffffffffffffffa8,in_R8,CONCAT44(iVar3,in_stack_ffffffffffffff98),
                     in_stack_00000008,sVar1,(void *)CONCAT44(iVar2,in_stack_ffffffffffffff80),
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffc8);
  return sVar1;
}

Assistant:

size_t ZSTD_compress_usingDict(ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize,
                         const void* dict, size_t dictSize,
                               int compressionLevel)
{
    {
        ZSTD_parameters const params = ZSTD_getParams_internal(compressionLevel, srcSize, dict ? dictSize : 0, ZSTD_cpm_noAttachDict);
        assert(params.fParams.contentSizeFlag == 1);
        ZSTD_CCtxParams_init_internal(&cctx->simpleApiParams, &params, (compressionLevel == 0) ? ZSTD_CLEVEL_DEFAULT: compressionLevel);
    }
    DEBUGLOG(4, "ZSTD_compress_usingDict (srcSize=%u)", (unsigned)srcSize);
    return ZSTD_compress_advanced_internal(cctx, dst, dstCapacity, src, srcSize, dict, dictSize, &cctx->simpleApiParams);
}